

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.h
# Opt level: O3

OrientationError * __thiscall
KDIS::DATA_TYPE::OrientationError::operator=(OrientationError *this,OrientationError *param_1)

{
  DataTypeBase local_80;
  short local_78;
  KFIXED<short,_(unsigned_char)__b_> local_70;
  DataTypeBase local_60;
  short local_58;
  KFIXED<short,_(unsigned_char)__b_> local_50;
  DataTypeBase local_40;
  short local_38;
  KFIXED<short,_(unsigned_char)__b_> local_30;
  
  local_40._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0022a398;
  local_38 = (param_1->m_AziErr).m_Val;
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_30,&this->m_AziErr);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_40);
  local_60._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0022a398;
  local_58 = (param_1->m_ElvErr).m_Val;
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_50,&this->m_ElvErr);
  DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_60);
  local_80._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0022a398;
  local_78 = (param_1->m_RotErr).m_Val;
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_70,&this->m_RotErr);
  DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_80);
  return this;
}

Assistant:

class KDIS_EXPORT OrientationError : public DataTypeBase
{
protected:

    KFIXED16_8 m_AziErr;

    KFIXED16_8 m_ElvErr;

    KFIXED16_8 m_RotErr;

public:

    static const KUINT16 ORIENTATION_ERROR_SIZE = 6;

    OrientationError();

    OrientationError( KFIXED16_8 Azimuth, KFIXED16_8 Elevation, KFIXED16_8 Rotation );

    OrientationError(KDataStream &stream) noexcept(false);

    virtual ~OrientationError();

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::SetAzimuthError
    //              KDIS::DATA_TYPE::OrientationError::GetAzimuthError
    // Description: Azimuth orientation error in radians.
    // Parameter:   KFIXED16_8 AE
    //************************************
    void SetAzimuthError( KFIXED16_8 AE );
    KFIXED16_8 GetAzimuthError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::SetElevationError
    //              KDIS::DATA_TYPE::OrientationError::GetElevationError
    // Description: Elevation orientation error in radians.
    // Parameter:   KFIXED16_8 EE
    //************************************
    void SetElevationError( KFIXED16_8 EE );
    KFIXED16_8 GetElevationError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::SetRotationError
    //              KDIS::DATA_TYPE::OrientationError::GetRotationError
    // Description: Rotation orientation error in radians.
    // Parameter:   KFIXED16_8 RE
    //************************************
    void SetRotationError( KFIXED16_8 RE );
    KFIXED16_8 GetRotationError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DataTypeBase::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const OrientationError & Value ) const;
    KBOOL operator != ( const OrientationError & Value ) const;
}